

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O2

void __thiscall LinearScan::GeneratorBailIn::~GeneratorBailIn(GeneratorBailIn *this)

{
  SListBase<LinearScan::GeneratorBailIn::BailInSymbol,_Memory::ArenaAllocator,_RealCount> *pSVar1;
  JitArenaAllocator *this_00;
  SListBase<LinearScan::GeneratorBailIn::BailInSymbol,_Memory::ArenaAllocator,_RealCount> *pSVar2;
  SListBase<LinearScan::GeneratorBailIn::BailInSymbol,_Memory::ArenaAllocator,_RealCount> *buffer;
  
  pSVar1 = this->bailInSymbols;
  this_00 = this->func->m_alloc;
  buffer = (SListBase<LinearScan::GeneratorBailIn::BailInSymbol,_Memory::ArenaAllocator,_RealCount>
            *)(pSVar1->super_SListNodeBase<Memory::ArenaAllocator>).next;
  while (buffer != pSVar1) {
    pSVar2 = (SListBase<LinearScan::GeneratorBailIn::BailInSymbol,_Memory::ArenaAllocator,_RealCount>
              *)(buffer->super_SListNodeBase<Memory::ArenaAllocator>).next;
    Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
              ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)this_00,buffer,
               0x20);
    buffer = pSVar2;
  }
  (pSVar1->super_SListNodeBase<Memory::ArenaAllocator>).next =
       &pSVar1->super_SListNodeBase<Memory::ArenaAllocator>;
  (pSVar1->super_RealCount).count = 0;
  pSVar1 = this->bailInSymbols;
  (pSVar1->super_SListNodeBase<Memory::ArenaAllocator>).next =
       &pSVar1->super_SListNodeBase<Memory::ArenaAllocator>;
  (pSVar1->super_RealCount).count = 0;
  Memory::
  DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,SListBase<LinearScan::GeneratorBailIn::BailInSymbol,Memory::ArenaAllocator,RealCount>>
            (this->func->m_alloc,pSVar1);
  BVSparse<Memory::JitArenaAllocator>::~BVSparse(&this->initializedRegs);
  return;
}

Assistant:

LinearScan::GeneratorBailIn::~GeneratorBailIn()
{
    this->bailInSymbols->Clear(this->func->m_alloc);
    this->bailInSymbols->Reset();
    JitAdelete(this->func->m_alloc, this->bailInSymbols);
}